

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_DefinePropertyValueValue(JSContext *ctx,JSValue this_obj,JSValue prop,JSValue val,int flags)

{
  JSValue v;
  JSValue v_00;
  JSValue val_00;
  JSAtom JVar1;
  JSContext *in_RCX;
  undefined8 in_RDX;
  int64_t in_RSI;
  JSValueUnion in_R8;
  JSValue in_stack_00000000;
  JSValue in_stack_00000010;
  int ret;
  JSAtom atom;
  JSAtom in_stack_ffffffffffffffac;
  JSContext *in_stack_ffffffffffffffb0;
  undefined1 *puVar2;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  JSAtom prop_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  prop_00 = (JSAtom)((ulong)in_RDX >> 0x20);
  puVar2 = &stack0x00000008;
  val_00.tag = in_RSI;
  val_00.u.float64 = in_R8.float64;
  JVar1 = JS_ValueToAtom(in_RCX,val_00);
  v.tag._0_4_ = in_stack_ffffffffffffffc0;
  v.u.ptr = puVar2;
  v.tag._4_4_ = in_stack_ffffffffffffffc4;
  JS_FreeValue(in_stack_ffffffffffffffb0,v);
  if (JVar1 == 0) {
    v_00.tag._0_4_ = in_stack_ffffffffffffffc0;
    v_00.u.ptr = puVar2;
    v_00.tag._4_4_ = in_stack_ffffffffffffffc4;
    JS_FreeValue(in_stack_ffffffffffffffb0,v_00);
    iVar3 = -1;
  }
  else {
    iVar3 = JS_DefinePropertyValue
                      ((JSContext *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_stack_00000010,prop_00,in_stack_00000000,prop.u.int32);
    JS_FreeAtom(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  return iVar3;
}

Assistant:

int JS_DefinePropertyValueValue(JSContext *ctx, JSValueConst this_obj,
                                JSValue prop, JSValue val, int flags)
{
    JSAtom atom;
    int ret;
    atom = JS_ValueToAtom(ctx, prop);
    JS_FreeValue(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL)) {
        JS_FreeValue(ctx, val);
        return -1;
    }
    ret = JS_DefinePropertyValue(ctx, this_obj, atom, val, flags);
    JS_FreeAtom(ctx, atom);
    return ret;
}